

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O3

void jsons_print_identity(lyout *out,lys_ident *ident,int *first)

{
  lys_module *plVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  lys_revision *plVar5;
  bool bVar6;
  int local_34 [2];
  int f;
  
  local_34[0] = 1;
  if (first == (int *)0x0) {
    pcVar2 = ",";
  }
  else {
    pcVar2 = "";
    if (*first == 0) {
      pcVar2 = ",";
    }
  }
  ly_print(out,"%s\"%s\":{",pcVar2,ident->name);
  if (ident->base_size != '\0') {
    ly_print(out,"\"bases\":[");
    local_34[0] = 0;
    if (ident->base_size != '\0') {
      uVar3 = 0;
      do {
        plVar1 = ident->base[uVar3]->module;
        pcVar2 = ",";
        if (uVar3 == 0) {
          pcVar2 = "";
        }
        bVar6 = plVar1->rev_size == '\0';
        pcVar4 = "@";
        if (bVar6) {
          pcVar4 = "";
        }
        plVar5 = (lys_revision *)0x1a29e4;
        if (!bVar6) {
          plVar5 = plVar1->rev;
        }
        ly_print(out,"%s\"%s%s%s:%s\"",pcVar2,plVar1->name,pcVar4,plVar5,ident->base[uVar3]->name);
        uVar3 = uVar3 + 1;
      } while (uVar3 < ident->base_size);
    }
    ly_print(out,"]");
  }
  jsons_print_text(out,"description","text",ident->dsc,1,local_34);
  jsons_print_text(out,"reference","text",ident->ref,1,local_34);
  jsons_print_status(out,ident->flags,local_34);
  jsons_print_iffeatures(out,ident->module,ident->iffeature,ident->iffeature_size,local_34);
  ly_print(out,"}");
  if (first != (int *)0x0) {
    *first = 0;
  }
  return;
}

Assistant:

static void
jsons_print_identity(struct lyout *out, const struct lys_ident *ident, int *first)
{
    int f = 1, j;
    struct lys_module *mod;

    ly_print(out, "%s\"%s\":{", (first && (*first)) ? "" : ",", ident->name);
    if (ident->base_size) {
        ly_print(out, "\"bases\":[");
        f = 0;
        for (j = 0; j < ident->base_size; ++j) {
            mod = ident->base[j]->module;
            ly_print(out, "%s\"%s%s%s:%s\"", j ? "," : "",
                     mod->name, mod->rev_size ? "@" : "", mod->rev_size ? mod->rev[0].date : "",
                     ident->base[j]->name);
        }
        ly_print(out, "]");
    }
    jsons_print_text(out, "description", "text", ident->dsc, 1, &f);
    jsons_print_text(out, "reference", "text", ident->ref, 1, &f);
    jsons_print_status(out, ident->flags, &f);
    jsons_print_iffeatures(out, ident->module, ident->iffeature, ident->iffeature_size, &f);

    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}